

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kiss_fft.c
# Opt level: O1

void kf_work(kiss_fft_cpx *Fout,kiss_fft_cpx *f,size_t fstride,int in_stride,int *factors,
            kiss_fft_cfg st)

{
  float fVar1;
  float fVar2;
  float fVar3;
  kiss_fft_cpx kVar4;
  uint uVar5;
  int iVar6;
  kiss_fft_cpx kVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  ulong uVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  kiss_fft_cpx *pkVar15;
  long lVar16;
  long lVar17;
  kiss_fft_cpx *pkVar18;
  int iVar19;
  ulong uVar20;
  uint uVar21;
  long lVar22;
  long lVar23;
  long lVar24;
  long lVar25;
  long lVar26;
  int iVar27;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar36 [64];
  undefined1 auVar37 [64];
  undefined1 auVar38 [64];
  undefined1 auVar39 [64];
  undefined1 auVar40 [64];
  undefined1 auVar41 [64];
  undefined1 auVar42 [64];
  float fVar43;
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  float fVar47;
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  float fVar53;
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  float fVar56;
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  float fVar62;
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  int local_60;
  
  uVar5 = *factors;
  iVar27 = factors[1];
  lVar16 = (long)iVar27;
  if (lVar16 == 1) {
    lVar17 = 0;
    do {
      *(kiss_fft_cpx *)((long)&Fout->r + lVar17) = *f;
      f = f + (long)in_stride * fstride;
      lVar17 = lVar17 + 8;
    } while ((long)(int)(iVar27 * uVar5) * 8 != lVar17);
  }
  else {
    lVar17 = 0;
    do {
      kf_work((kiss_fft_cpx *)((long)&Fout->r + lVar17),f,(long)(int)uVar5 * fstride,in_stride,
              factors + 2,st);
      f = f + (long)in_stride * fstride;
      lVar17 = lVar17 + lVar16 * 8;
    } while ((long)(int)(iVar27 * uVar5) * 8 != lVar17);
  }
  auVar33 = _DAT_001e3870;
  switch(uVar5) {
  case 2:
    pkVar15 = st->twiddles;
    lVar17 = 0;
    do {
      auVar48._0_4_ = -Fout[lVar16 + lVar17].i;
      auVar48._4_4_ = 0x80000000;
      auVar48._8_4_ = 0x80000000;
      auVar48._12_4_ = 0x80000000;
      auVar54._8_8_ = 0;
      auVar54._0_4_ = pkVar15->r;
      auVar54._4_4_ = pkVar15->i;
      auVar34 = vpermt2ps_avx512vl(ZEXT416((uint)Fout[lVar16 + lVar17].i),auVar33,auVar48);
      auVar35 = vshufps_avx(auVar54,auVar54,0xe1);
      auVar44._0_4_ = auVar35._0_4_ * auVar34._0_4_;
      auVar44._4_4_ = auVar35._4_4_ * auVar34._4_4_;
      auVar44._8_4_ = auVar35._8_4_ * auVar34._8_4_;
      auVar44._12_4_ = auVar35._12_4_ * auVar34._12_4_;
      fVar43 = Fout[lVar16 + lVar17].r;
      auVar14._4_4_ = fVar43;
      auVar14._0_4_ = fVar43;
      auVar14._8_4_ = fVar43;
      auVar14._12_4_ = fVar43;
      auVar34 = vfmadd231ps_avx512vl(auVar44,auVar54,auVar14);
      auVar49._8_8_ = 0;
      auVar49._0_4_ = Fout[lVar17].r;
      auVar49._4_4_ = Fout[lVar17].i;
      auVar35 = vsubps_avx(auVar49,auVar34);
      kVar7 = (kiss_fft_cpx)vmovlps_avx(auVar35);
      Fout[lVar16 + lVar17] = kVar7;
      auVar45._0_4_ = auVar34._0_4_ + Fout[lVar17].r;
      auVar45._4_4_ = auVar34._4_4_ + Fout[lVar17].i;
      auVar45._8_4_ = auVar34._8_4_ + 0.0;
      auVar45._12_4_ = auVar34._12_4_ + 0.0;
      kVar7 = (kiss_fft_cpx)vmovlps_avx(auVar45);
      Fout[lVar17] = kVar7;
      lVar17 = lVar17 + 1;
      pkVar15 = pkVar15 + fstride;
    } while (iVar27 != (int)lVar17);
    break;
  case 3:
    fVar43 = st->twiddles[lVar16 * fstride].i;
    lVar24 = 0;
    auVar52._8_4_ = 0xbf000000;
    auVar52._0_8_ = 0xbf000000bf000000;
    auVar52._12_4_ = 0xbf000000;
    lVar17 = lVar16;
    do {
      auVar58._0_4_ = -Fout[lVar16].i;
      auVar58._4_4_ = 0x80000000;
      auVar58._8_4_ = 0x80000000;
      auVar58._12_4_ = 0x80000000;
      auVar72._0_4_ = -Fout[lVar16 * 2].i;
      auVar72._4_4_ = 0x80000000;
      auVar72._8_4_ = 0x80000000;
      auVar72._12_4_ = 0x80000000;
      auVar76._8_8_ = 0;
      auVar76._0_8_ = *(ulong *)((long)&st->twiddles[0].r + lVar24);
      auVar34 = vpermt2ps_avx512vl(ZEXT416((uint)Fout[lVar16].i),auVar33,auVar58);
      auVar35 = vshufps_avx(auVar76,auVar76,0xe1);
      auVar55._0_4_ = auVar35._0_4_ * auVar34._0_4_;
      auVar55._4_4_ = auVar35._4_4_ * auVar34._4_4_;
      auVar55._8_4_ = auVar35._8_4_ * auVar34._8_4_;
      auVar55._12_4_ = auVar35._12_4_ * auVar34._12_4_;
      fVar47 = Fout[lVar16].r;
      auVar12._4_4_ = fVar47;
      auVar12._0_4_ = fVar47;
      auVar12._8_4_ = fVar47;
      auVar12._12_4_ = fVar47;
      auVar34 = vfmadd231ps_avx512vl(auVar55,auVar76,auVar12);
      auVar59._8_8_ = 0;
      auVar59._0_8_ = *(ulong *)((long)&st->twiddles[0].r + lVar24 * 2);
      auVar28 = vpermt2ps_avx512vl(ZEXT416((uint)Fout[lVar16 * 2].i),auVar33,auVar72);
      auVar35 = vshufps_avx(auVar59,auVar59,0xe1);
      auVar68._0_4_ = auVar35._0_4_ * auVar28._0_4_;
      auVar68._4_4_ = auVar35._4_4_ * auVar28._4_4_;
      auVar68._8_4_ = auVar35._8_4_ * auVar28._8_4_;
      auVar68._12_4_ = auVar35._12_4_ * auVar28._12_4_;
      fVar47 = Fout[lVar16 * 2].r;
      auVar13._4_4_ = fVar47;
      auVar13._0_4_ = fVar47;
      auVar13._8_4_ = fVar47;
      auVar13._12_4_ = fVar47;
      auVar35 = vfmadd231ps_avx512vl(auVar68,auVar59,auVar13);
      auVar60._0_4_ = auVar34._0_4_ + auVar35._0_4_;
      auVar60._4_4_ = auVar34._4_4_ + auVar35._4_4_;
      auVar60._8_4_ = auVar34._8_4_ + auVar35._8_4_;
      auVar60._12_4_ = auVar34._12_4_ + auVar35._12_4_;
      auVar34 = vsubps_avx(auVar34,auVar35);
      auVar35 = vmovshdup_avx(auVar34);
      auVar73._8_8_ = 0;
      auVar73._0_4_ = Fout->r;
      auVar73._4_4_ = Fout->i;
      auVar28 = vfmadd231ps_fma(auVar73,auVar60,auVar52);
      kVar7 = (kiss_fft_cpx)vmovlps_avx(auVar28);
      Fout[lVar16] = kVar7;
      fVar47 = fVar43 * auVar34._0_4_;
      fVar53 = fVar43 * auVar35._0_4_;
      auVar61._0_4_ = auVar60._0_4_ + (*Fout).r;
      auVar61._4_4_ = auVar60._4_4_ + (*Fout).i;
      auVar61._8_4_ = auVar60._8_4_ + 0.0;
      auVar61._12_4_ = auVar60._12_4_ + 0.0;
      kVar7 = (kiss_fft_cpx)vmovlps_avx(auVar61);
      *Fout = kVar7;
      Fout[lVar16 * 2].r = fVar53 + Fout[lVar16].r;
      Fout[lVar16 * 2].i = Fout[lVar16].i - fVar47;
      Fout[lVar16].r = Fout[lVar16].r - fVar53;
      Fout[lVar16].i = fVar47 + Fout[lVar16].i;
      Fout = Fout + 1;
      lVar24 = lVar24 + fstride * 8;
      lVar17 = lVar17 + -1;
    } while (lVar17 != 0);
    break;
  case 4:
    iVar27 = st->inverse;
    pkVar18 = st->twiddles;
    lVar17 = 0;
    lVar24 = 0;
    pkVar15 = pkVar18;
    do {
      auVar50._0_4_ = -Fout[lVar16 + lVar17].i;
      auVar50._4_4_ = 0x80000000;
      auVar50._8_4_ = 0x80000000;
      auVar50._12_4_ = 0x80000000;
      auVar57._0_4_ = -Fout[lVar16 * 2 + lVar17].i;
      auVar57._4_4_ = 0x80000000;
      auVar57._8_4_ = 0x80000000;
      auVar57._12_4_ = 0x80000000;
      auVar69._0_4_ = -Fout[lVar16 * 3 + lVar17].i;
      auVar69._4_4_ = 0x80000000;
      auVar69._8_4_ = 0x80000000;
      auVar69._12_4_ = 0x80000000;
      auVar74._8_8_ = 0;
      auVar74._0_8_ = *(ulong *)((long)&pkVar18->r + lVar24);
      auVar34 = vpermt2ps_avx512vl(ZEXT416((uint)Fout[lVar16 + lVar17].i),auVar33,auVar50);
      auVar35 = vshufps_avx(auVar74,auVar74,0xe1);
      auVar46._0_4_ = auVar35._0_4_ * auVar34._0_4_;
      auVar46._4_4_ = auVar35._4_4_ * auVar34._4_4_;
      auVar46._8_4_ = auVar35._8_4_ * auVar34._8_4_;
      auVar46._12_4_ = auVar35._12_4_ * auVar34._12_4_;
      fVar43 = Fout[lVar16 + lVar17].r;
      auVar71._4_4_ = fVar43;
      auVar71._0_4_ = fVar43;
      auVar71._8_4_ = fVar43;
      auVar71._12_4_ = fVar43;
      auVar34 = vfmadd231ps_avx512vl(auVar46,auVar74,auVar71);
      auVar51._8_8_ = 0;
      auVar51._0_4_ = pkVar15->r;
      auVar51._4_4_ = pkVar15->i;
      auVar28 = vpermt2ps_avx512vl(ZEXT416((uint)Fout[lVar16 * 3 + lVar17].i),auVar33,auVar69);
      auVar35 = vshufps_avx(auVar51,auVar51,0xe1);
      auVar63._0_4_ = auVar35._0_4_ * auVar28._0_4_;
      auVar63._4_4_ = auVar35._4_4_ * auVar28._4_4_;
      auVar63._8_4_ = auVar35._8_4_ * auVar28._8_4_;
      auVar63._12_4_ = auVar35._12_4_ * auVar28._12_4_;
      fVar43 = Fout[lVar16 * 3 + lVar17].r;
      auVar29._4_4_ = fVar43;
      auVar29._0_4_ = fVar43;
      auVar29._8_4_ = fVar43;
      auVar29._12_4_ = fVar43;
      auVar35 = vfmadd231ps_avx512vl(auVar63,auVar51,auVar29);
      auVar70._0_4_ = auVar34._0_4_ + auVar35._0_4_;
      auVar70._4_4_ = auVar34._4_4_ + auVar35._4_4_;
      auVar70._8_4_ = auVar34._8_4_ + auVar35._8_4_;
      auVar70._12_4_ = auVar34._12_4_ + auVar35._12_4_;
      auVar28 = vsubps_avx(auVar34,auVar35);
      auVar35 = vmovshdup_avx(auVar28);
      auVar64._8_8_ = 0;
      auVar64._0_8_ = *(ulong *)((long)&pkVar18->r + lVar24 * 2);
      auVar31 = vpermt2ps_avx512vl(ZEXT416((uint)Fout[lVar16 * 2 + lVar17].i),auVar33,auVar57);
      auVar34 = vshufps_avx(auVar64,auVar64,0xe1);
      auVar75._0_4_ = auVar34._0_4_ * auVar31._0_4_;
      auVar75._4_4_ = auVar34._4_4_ * auVar31._4_4_;
      auVar75._8_4_ = auVar34._8_4_ * auVar31._8_4_;
      auVar75._12_4_ = auVar34._12_4_ * auVar31._12_4_;
      fVar43 = Fout[lVar16 * 2 + lVar17].r;
      auVar30._4_4_ = fVar43;
      auVar30._0_4_ = fVar43;
      auVar30._8_4_ = fVar43;
      auVar30._12_4_ = fVar43;
      auVar32 = vfmadd231ps_avx512vl(auVar75,auVar64,auVar30);
      kVar7 = Fout[lVar17];
      auVar65._8_8_ = 0;
      auVar65._0_4_ = kVar7.r;
      auVar65._4_4_ = kVar7.i;
      auVar31 = vsubps_avx(auVar65,auVar32);
      auVar34 = vmovshdup_avx(auVar31);
      auVar66._0_4_ = auVar32._0_4_ + kVar7.r;
      auVar66._4_4_ = auVar32._4_4_ + kVar7.i;
      auVar66._8_4_ = auVar32._8_4_ + 0.0;
      auVar66._12_4_ = auVar32._12_4_ + 0.0;
      Fout[lVar17].r = auVar66._0_4_;
      fVar43 = (float)vextractps_avx(auVar66,1);
      Fout[lVar17].i = fVar43;
      auVar32 = vsubps_avx(auVar66,auVar70);
      kVar7 = (kiss_fft_cpx)vmovlps_avx(auVar32);
      Fout[lVar16 * 2 + lVar17] = kVar7;
      auVar67._0_4_ = auVar70._0_4_ + Fout[lVar17].r;
      auVar67._4_4_ = auVar70._4_4_ + Fout[lVar17].i;
      auVar67._8_4_ = auVar70._8_4_ + 0.0;
      auVar67._12_4_ = auVar70._12_4_ + 0.0;
      kVar7 = (kiss_fft_cpx)vmovlps_avx(auVar67);
      Fout[lVar17] = kVar7;
      fVar47 = auVar35._0_4_;
      fVar56 = auVar31._0_4_;
      fVar43 = auVar28._0_4_;
      fVar53 = auVar34._0_4_;
      if (iVar27 == 0) {
        Fout[lVar16 + lVar17].r = fVar56 + fVar47;
        Fout[lVar16 + lVar17].i = fVar53 - fVar43;
        Fout[lVar16 * 3 + lVar17].r = fVar56 - fVar47;
        fVar62 = fVar53 + fVar43;
      }
      else {
        fVar62 = fVar53 - fVar43;
        Fout[lVar16 + lVar17].r = fVar56 - fVar47;
        Fout[lVar16 + lVar17].i = fVar53 + fVar43;
        Fout[lVar16 * 3 + lVar17].r = fVar56 + fVar47;
      }
      pkVar15 = pkVar15 + fstride * 3;
      Fout[lVar16 * 3 + lVar17].i = fVar62;
      lVar24 = lVar24 + fstride * 8;
      lVar17 = lVar17 + 1;
    } while (lVar16 != lVar17);
    break;
  case 5:
    if (iVar27 != 0) {
      lVar17 = lVar16 * fstride;
      fVar43 = st->twiddles[lVar17].r;
      fVar47 = st->twiddles[lVar17].i;
      fVar53 = st->twiddles[lVar17 * 2].r;
      fVar56 = st->twiddles[lVar17 * 2].i;
      lVar26 = (long)(iVar27 * 4);
      lVar24 = (long)(iVar27 * 3);
      lVar17 = (long)(iVar27 * 2);
      lVar22 = 0;
      lVar23 = 0;
      lVar25 = 0;
      do {
        fVar62 = Fout[lVar25].r;
        fVar1 = Fout[lVar25].i;
        fVar2 = *(float *)((long)&st->twiddles[0].r + lVar23 * 2);
        fVar3 = *(float *)((long)&st->twiddles[0].i + lVar23 * 2);
        auVar31 = vfmsub231ss_fma(ZEXT416((uint)(fVar3 * Fout[lVar16 + lVar25].i)),
                                  ZEXT416((uint)Fout[lVar16 + lVar25].r),ZEXT416((uint)fVar2));
        auVar35 = vfmadd231ss_fma(ZEXT416((uint)(fVar2 * Fout[lVar16 + lVar25].i)),
                                  ZEXT416((uint)Fout[lVar16 + lVar25].r),ZEXT416((uint)fVar3));
        fVar2 = (&st->twiddles[0].r)[lVar23];
        fVar3 = (&st->twiddles[0].i)[lVar23];
        auVar32 = vfmsub231ss_fma(ZEXT416((uint)(fVar3 * Fout[lVar17 + lVar25].i)),
                                  ZEXT416((uint)Fout[lVar17 + lVar25].r),ZEXT416((uint)fVar2));
        auVar33 = vfmadd231ss_fma(ZEXT416((uint)(fVar2 * Fout[lVar17 + lVar25].i)),
                                  ZEXT416((uint)Fout[lVar17 + lVar25].r),ZEXT416((uint)fVar3));
        fVar2 = (&st->twiddles[0].r)[lVar22];
        fVar3 = (&st->twiddles[0].i)[lVar22];
        auVar71 = vfmsub231ss_fma(ZEXT416((uint)(fVar3 * Fout[lVar24 + lVar25].i)),
                                  ZEXT416((uint)Fout[lVar24 + lVar25].r),ZEXT416((uint)fVar2));
        auVar34 = vfmadd231ss_fma(ZEXT416((uint)(fVar2 * Fout[lVar24 + lVar25].i)),
                                  ZEXT416((uint)Fout[lVar24 + lVar25].r),ZEXT416((uint)fVar3));
        fVar2 = st->twiddles[lVar23].r;
        auVar30 = ZEXT416((uint)st->twiddles[lVar23].i);
        auVar28 = vmulss_avx512f(auVar30,ZEXT416((uint)Fout[lVar26 + lVar25].i));
        auVar29 = vfmsub231ss_avx512f(auVar28,ZEXT416((uint)Fout[lVar26 + lVar25].r),
                                      ZEXT416((uint)fVar2));
        auVar28 = vfmadd231ss_fma(ZEXT416((uint)(fVar2 * Fout[lVar26 + lVar25].i)),
                                  ZEXT416((uint)Fout[lVar26 + lVar25].r),auVar30);
        auVar30 = vaddss_avx512f(auVar31,auVar29);
        fVar2 = auVar28._0_4_ + auVar35._0_4_;
        auVar31 = vsubss_avx512f(auVar31,auVar29);
        fVar3 = auVar32._0_4_ + auVar71._0_4_;
        fVar8 = auVar33._0_4_ + auVar34._0_4_;
        fVar9 = auVar32._0_4_ - auVar71._0_4_;
        fVar10 = auVar33._0_4_ - auVar34._0_4_;
        Fout[lVar25].r = fVar3 + auVar30._0_4_ + fVar62;
        Fout[lVar25].i = fVar8 + fVar2 + fVar1;
        auVar33 = vfmadd213ss_fma(ZEXT416((uint)fVar43),auVar30,ZEXT416((uint)fVar62));
        auVar34 = vfmadd231ss_fma(auVar33,ZEXT416((uint)fVar3),ZEXT416((uint)fVar53));
        auVar33 = vfmadd213ss_fma(ZEXT416((uint)fVar43),ZEXT416((uint)fVar2),ZEXT416((uint)fVar1));
        auVar33 = vfmadd231ss_fma(auVar33,ZEXT416((uint)fVar8),ZEXT416((uint)fVar53));
        auVar32 = vmulss_avx512f(ZEXT416((uint)fVar56),ZEXT416((uint)fVar10));
        auVar71 = ZEXT416((uint)(auVar35._0_4_ - auVar28._0_4_));
        auVar35 = vfmadd231ss_avx512f(auVar32,auVar71,ZEXT416((uint)fVar47));
        auVar28 = vmulss_avx512f(ZEXT416((uint)fVar56),ZEXT416((uint)fVar9));
        auVar28 = vfnmsub231ss_avx512f(auVar28,auVar31,ZEXT416((uint)fVar47));
        auVar32 = vsubss_avx512f(auVar34,auVar35);
        Fout[lVar16 + lVar25].r = auVar32._0_4_;
        auVar32 = vsubss_avx512f(auVar33,auVar28);
        Fout[lVar16 + lVar25].i = auVar32._0_4_;
        auVar35 = vaddss_avx512f(auVar35,auVar34);
        Fout[lVar26 + lVar25].r = auVar35._0_4_;
        auVar33 = vaddss_avx512f(auVar33,auVar28);
        Fout[lVar26 + lVar25].i = auVar33._0_4_;
        auVar33 = vfmadd213ss_fma(auVar30,ZEXT416((uint)fVar53),ZEXT416((uint)fVar62));
        auVar35 = vfmadd231ss_fma(auVar33,ZEXT416((uint)fVar43),ZEXT416((uint)fVar3));
        auVar33 = vfmadd213ss_fma(ZEXT416((uint)fVar2),ZEXT416((uint)fVar53),ZEXT416((uint)fVar1));
        auVar33 = vfmadd231ss_fma(auVar33,ZEXT416((uint)fVar43),ZEXT416((uint)fVar8));
        auVar28 = vfnmadd231ss_fma(ZEXT416((uint)(fVar10 * fVar47)),ZEXT416((uint)fVar56),auVar71);
        auVar34 = vfmsub231ss_fma(ZEXT416((uint)(fVar9 * fVar47)),ZEXT416((uint)fVar56),auVar31);
        Fout[lVar17 + lVar25].r = auVar28._0_4_ + auVar35._0_4_;
        Fout[lVar17 + lVar25].i = auVar33._0_4_ + auVar34._0_4_;
        Fout[lVar24 + lVar25].r = auVar35._0_4_ - auVar28._0_4_;
        Fout[lVar24 + lVar25].i = auVar33._0_4_ - auVar34._0_4_;
        lVar25 = lVar25 + 1;
        lVar23 = lVar23 + fstride * 4;
        lVar22 = lVar22 + fstride * 6;
      } while (lVar16 != lVar25);
    }
    break;
  default:
    iVar6 = st->nfft;
    pkVar15 = (kiss_fft_cpx *)malloc((long)(int)uVar5 * 8);
    auVar33 = _DAT_001e3870;
    if (0 < iVar27) {
      auVar36 = vpbroadcastq_avx512f();
      auVar36 = vpmuludq_avx512f(auVar36,_DAT_001e3880);
      auVar37 = vpbroadcastq_avx512f();
      auVar38 = vpbroadcastq_avx512f();
      auVar39 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
      lVar17 = 0;
      do {
        if (0 < (int)uVar5) {
          auVar40 = vpbroadcastq_avx512f();
          auVar40 = vpaddq_avx512f(auVar40,auVar36);
          uVar20 = 0;
          do {
            auVar41 = vpbroadcastq_avx512f();
            auVar41 = vporq_avx512f(auVar41,auVar39);
            uVar11 = vpcmpuq_avx512f(auVar41,auVar38,2);
            auVar41 = vpgatherqq_avx512f(*Fout);
            auVar42._8_8_ = (ulong)((byte)(uVar11 >> 1) & 1) * auVar41._8_8_;
            auVar42._0_8_ = (ulong)((byte)uVar11 & 1) * auVar41._0_8_;
            auVar42._16_8_ = (ulong)((byte)(uVar11 >> 2) & 1) * auVar41._16_8_;
            auVar42._24_8_ = (ulong)((byte)(uVar11 >> 3) & 1) * auVar41._24_8_;
            auVar42._32_8_ = (ulong)((byte)(uVar11 >> 4) & 1) * auVar41._32_8_;
            auVar42._40_8_ = (ulong)((byte)(uVar11 >> 5) & 1) * auVar41._40_8_;
            auVar42._48_8_ = (ulong)((byte)(uVar11 >> 6) & 1) * auVar41._48_8_;
            auVar42._56_8_ = (uVar11 >> 7) * auVar41._56_8_;
            auVar41 = vmovdqu64_avx512f(auVar42);
            *(undefined1 (*) [64])(pkVar15 + uVar20) = auVar41;
            uVar20 = uVar20 + 8;
            auVar40 = vpaddq_avx512f(auVar40,auVar37);
          } while ((uVar5 + 7 & 0xfffffff8) != uVar20);
          if (0 < (int)uVar5) {
            kVar7 = *pkVar15;
            uVar21 = 0;
            lVar24 = lVar17;
            do {
              Fout[lVar24] = kVar7;
              if (1 < (int)uVar5) {
                local_60 = (int)fstride;
                auVar40 = ZEXT864((ulong)Fout[lVar24]);
                lVar26 = 0;
                iVar27 = 0;
                do {
                  iVar27 = iVar27 + (int)lVar24 * local_60;
                  iVar19 = iVar6;
                  if (iVar27 < iVar6) {
                    iVar19 = 0;
                  }
                  iVar27 = iVar27 - iVar19;
                  auVar31._0_4_ = -pkVar15[lVar26 + 1].i;
                  auVar31._4_4_ = 0x80000000;
                  auVar31._8_4_ = 0x80000000;
                  auVar31._12_4_ = 0x80000000;
                  auVar32._8_8_ = 0;
                  auVar32._0_4_ = st->twiddles[iVar27].r;
                  auVar32._4_4_ = st->twiddles[iVar27].i;
                  auVar34 = vpermt2ps_avx512vl(ZEXT416((uint)pkVar15[lVar26 + 1].i),auVar33,auVar31)
                  ;
                  auVar35 = vshufps_avx(auVar32,auVar32,0xe1);
                  auVar28._0_4_ = auVar35._0_4_ * auVar34._0_4_;
                  auVar28._4_4_ = auVar35._4_4_ * auVar34._4_4_;
                  auVar28._8_4_ = auVar35._8_4_ * auVar34._8_4_;
                  auVar28._12_4_ = auVar35._12_4_ * auVar34._12_4_;
                  fVar43 = pkVar15[lVar26 + 1].r;
                  auVar35._4_4_ = fVar43;
                  auVar35._0_4_ = fVar43;
                  auVar35._8_4_ = fVar43;
                  auVar35._12_4_ = fVar43;
                  auVar35 = vfmadd231ps_avx512vl(auVar28,auVar32,auVar35);
                  auVar34._0_4_ = auVar40._0_4_ + auVar35._0_4_;
                  auVar34._4_4_ = auVar40._4_4_ + auVar35._4_4_;
                  auVar34._8_4_ = auVar40._8_4_ + auVar35._8_4_;
                  auVar34._12_4_ = auVar40._12_4_ + auVar35._12_4_;
                  auVar40 = ZEXT1664(auVar34);
                  kVar4 = (kiss_fft_cpx)vmovlps_avx(auVar34);
                  Fout[lVar24] = kVar4;
                  lVar26 = lVar26 + 1;
                } while ((ulong)uVar5 - 1 != lVar26);
              }
              lVar24 = lVar24 + lVar16;
              uVar21 = uVar21 + 1;
            } while (uVar21 != uVar5);
          }
        }
        lVar17 = lVar17 + 1;
      } while (lVar17 != lVar16);
    }
    free(pkVar15);
    return;
  }
  return;
}

Assistant:

static
void kf_work(
        kiss_fft_cpx * Fout,
        const kiss_fft_cpx * f,
        const size_t fstride,
        int in_stride,
        int * factors,
        const kiss_fft_cfg st
        )
{
    kiss_fft_cpx * Fout_beg=Fout;
    const int p=*factors++; /* the radix  */
    const int m=*factors++; /* stage's fft length/p */
    const kiss_fft_cpx * Fout_end = Fout + p*m;

#ifdef _OPENMP
    /*
    use openmp extensions at the 
    top-level (not recursive)
    */
    if (fstride==1 && p<=5)
    {
        int k;

        /* execute the p different work units in different threads */
#       pragma omp parallel for
        for (k=0;k<p;++k) 
            kf_work( Fout +k*m, f+ fstride*in_stride*k,fstride*p,in_stride,factors,st);
        /* all threads have joined by this point */

        switch (p) {
            case 2: kf_bfly2(Fout,fstride,st,m); break;
            case 3: kf_bfly3(Fout,fstride,st,m); break; 
            case 4: kf_bfly4(Fout,fstride,st,m); break;
            case 5: kf_bfly5(Fout,fstride,st,m); break; 
            default: kf_bfly_generic(Fout,fstride,st,m,p); break;
        }
        return;
    }
#endif

    if (m==1) {
        do{
            *Fout = *f;
            f += fstride*in_stride;
        }while(++Fout != Fout_end );
    }else{
        do{
            /*
            recursive call:
            DFT of size m*p performed by doing
            p instances of smaller DFTs of size m, 
            each one takes a decimated version of the input
            */
            kf_work( Fout , f, fstride*p, in_stride, factors,st);
            f += fstride*in_stride;
        }while( (Fout += m) != Fout_end );
    }

    Fout=Fout_beg;

    /* recombine the p smaller DFTs */
    switch (p) {
        case 2: kf_bfly2(Fout,fstride,st,m); break;
        case 3: kf_bfly3(Fout,fstride,st,m); break; 
        case 4: kf_bfly4(Fout,fstride,st,m); break;
        case 5: kf_bfly5(Fout,fstride,st,m); break; 
        default: kf_bfly_generic(Fout,fstride,st,m,p); break;
    }
}